

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::_valid_subcommand(App *this,string *current,bool ignore_used)

{
  App *pAVar1;
  
  do {
    if (((this->require_subcommand_max_ == 0) ||
        ((ulong)((long)(this->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) < this->require_subcommand_max_)) ||
       (this->subcommand_fallthrough_ != true)) {
      pAVar1 = _find_subcommand(this,current,true,ignore_used);
      if (pAVar1 != (App *)0x0) {
        return true;
      }
      if (this->subcommand_fallthrough_ != true) {
        return false;
      }
    }
    this = this->parent_;
    if (this == (App *)0x0) {
      return false;
    }
  } while( true );
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::_valid_subcommand(const std::string &current, bool ignore_used) const {
    // Don't match if max has been reached - but still check parents
    if(require_subcommand_max_ != 0 && parsed_subcommands_.size() >= require_subcommand_max_ &&
       subcommand_fallthrough_) {
        return parent_ != nullptr && parent_->_valid_subcommand(current, ignore_used);
    }
    auto *com = _find_subcommand(current, true, ignore_used);
    if(com != nullptr) {
        return true;
    }
    // Check parent if exists, else return false
    if(subcommand_fallthrough_) {
        return parent_ != nullptr && parent_->_valid_subcommand(current, ignore_used);
    }
    return false;
}